

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMulti.c
# Opt level: O1

Abc_Ntk_t *
Abc_NtkMulti(Abc_Ntk_t *pNtk,int nThresh,int nFaninMax,int fCnf,int fMulti,int fSimple,int fFactor)

{
  uint *puVar1;
  long *plVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *pAVar8;
  DdNode *n;
  ProgressBar *p;
  Abc_Ntk_t *pAVar9;
  Vec_Ptr_t *pVVar10;
  long lVar11;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                  ,0x44,"Abc_Ntk_t *Abc_NtkMulti(Abc_Ntk_t *, int, int, int, int, int, int)");
  }
  if (nThresh < 0) {
    __assert_fail("nThresh >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                  ,0x45,"Abc_Ntk_t *Abc_NtkMulti(Abc_Ntk_t *, int, int, int, int, int, int)");
  }
  if (nFaninMax < 2) {
    __assert_fail("nFaninMax > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                  ,0x46,"Abc_Ntk_t *Abc_NtkMulti(Abc_Ntk_t *, int, int, int, int, int, int)");
  }
  iVar4 = Abc_NtkGetChoiceNum(pNtk);
  if (iVar4 != 0) {
    puts("Warning: The choice nodes in the AIG are removed by renoding.");
  }
  if (fCnf == 0) {
    if (fMulti == 0) {
      if (fSimple == 0) {
        if (fFactor == 0) {
          Abc_NtkMultiSetBounds(pNtk,nThresh,nFaninMax);
        }
        else {
          pVVar10 = pNtk->vObjs;
          iVar4 = pVVar10->nSize;
          if (0 < (long)iVar4) {
            lVar11 = 0;
            do {
              if ((pVVar10->pArray[lVar11] != (void *)0x0) &&
                 ((*(byte *)((long)pVVar10->pArray[lVar11] + 0x14) & 0x10) != 0)) {
                __assert_fail("pNode->fMarkA == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                              ,0x254,"void Abc_NtkMultiSetBoundsFactor(Abc_Ntk_t *)");
              }
              lVar11 = lVar11 + 1;
            } while (iVar4 != lVar11);
            if (0 < iVar4) {
              lVar11 = 0;
              do {
                pAVar7 = (Abc_Obj_t *)pVVar10->pArray[lVar11];
                if ((pAVar7 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar7->field_0x14 & 0xf) == 7)) {
                  uVar6 = 0;
                  if (1 < (pAVar7->vFanouts).nSize) {
                    iVar4 = Abc_NodeIsMuxControlType(pAVar7);
                    uVar6 = (uint)(iVar4 == 0) << 4;
                  }
                  *(uint *)&pAVar7->field_0x14 = *(uint *)&pAVar7->field_0x14 & 0xffffffef | uVar6;
                }
                lVar11 = lVar11 + 1;
                pVVar10 = pNtk->vObjs;
              } while (lVar11 < pVVar10->nSize);
            }
          }
          pVVar10 = pNtk->vCos;
          if (0 < pVVar10->nSize) {
            lVar11 = 0;
            do {
              puVar1 = (uint *)(*(long *)(*(long *)(*(long *)(*pVVar10->pArray[lVar11] + 0x20) + 8)
                                         + (long)**(int **)((long)pVVar10->pArray[lVar11] + 0x20) *
                                           8) + 0x14);
              *puVar1 = *puVar1 | 0x10;
              lVar11 = lVar11 + 1;
              pVVar10 = pNtk->vCos;
            } while (lVar11 < pVVar10->nSize);
          }
        }
      }
      else {
        pVVar10 = pNtk->vObjs;
        iVar4 = pVVar10->nSize;
        if (0 < (long)iVar4) {
          lVar11 = 0;
          do {
            if ((pVVar10->pArray[lVar11] != (void *)0x0) &&
               ((*(byte *)((long)pVVar10->pArray[lVar11] + 0x14) & 0x10) != 0)) {
              __assert_fail("pNode->fMarkA == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                            ,0x23d,"void Abc_NtkMultiSetBoundsSimple(Abc_Ntk_t *)");
            }
            lVar11 = lVar11 + 1;
          } while (iVar4 != lVar11);
          if (0 < iVar4) {
            lVar11 = 0;
            do {
              pvVar3 = pVVar10->pArray[lVar11];
              if ((pvVar3 != (void *)0x0) && ((*(uint *)((long)pvVar3 + 0x14) & 0xf) == 7)) {
                *(uint *)((long)pvVar3 + 0x14) = *(uint *)((long)pvVar3 + 0x14) | 0x10;
              }
              lVar11 = lVar11 + 1;
              pVVar10 = pNtk->vObjs;
            } while (lVar11 < pVVar10->nSize);
          }
        }
      }
    }
    else {
      pVVar10 = pNtk->vObjs;
      iVar4 = pVVar10->nSize;
      if (0 < (long)iVar4) {
        lVar11 = 0;
        do {
          if ((pVVar10->pArray[lVar11] != (void *)0x0) &&
             ((*(byte *)((long)pVVar10->pArray[lVar11] + 0x14) & 0x10) != 0)) {
            __assert_fail("pNode->fMarkA == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                          ,0x210,"void Abc_NtkMultiSetBoundsMulti(Abc_Ntk_t *, int)");
          }
          lVar11 = lVar11 + 1;
        } while (iVar4 != lVar11);
        if (0 < iVar4) {
          lVar11 = 0;
          do {
            pAVar7 = (Abc_Obj_t *)pVVar10->pArray[lVar11];
            if ((pAVar7 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar7->field_0x14 & 0xf) == 7)) {
              iVar4 = (pAVar7->vFanouts).nSize;
              iVar5 = Abc_NodeMffcSizeStop(pAVar7);
              if (nThresh < (iVar4 + -1) * iVar5) {
                pAVar7->field_0x14 = pAVar7->field_0x14 | 0x10;
              }
              if ((pAVar7->field_0x15 & 4) != 0) {
                puVar1 = (uint *)((long)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray] +
                                 0x14);
                *puVar1 = *puVar1 | 0x10;
              }
              if ((pAVar7->field_0x15 & 8) != 0) {
                puVar1 = (uint *)((long)pAVar7->pNtk->vObjs->pArray[(pAVar7->vFanins).pArray[1]] +
                                 0x14);
                *puVar1 = *puVar1 | 0x10;
              }
            }
            lVar11 = lVar11 + 1;
            pVVar10 = pNtk->vObjs;
          } while (lVar11 < pVVar10->nSize);
        }
      }
      pVVar10 = pNtk->vCos;
      if (0 < pVVar10->nSize) {
        lVar11 = 0;
        do {
          puVar1 = (uint *)(*(long *)(*(long *)(*(long *)(*pVVar10->pArray[lVar11] + 0x20) + 8) +
                                     (long)**(int **)((long)pVVar10->pArray[lVar11] + 0x20) * 8) +
                           0x14);
          *puVar1 = *puVar1 | 0x10;
          lVar11 = lVar11 + 1;
          pVVar10 = pNtk->vCos;
        } while (lVar11 < pVVar10->nSize);
      }
    }
  }
  else {
    pVVar10 = pNtk->vObjs;
    iVar4 = pVVar10->nSize;
    if (0 < (long)iVar4) {
      lVar11 = 0;
      do {
        if ((pVVar10->pArray[lVar11] != (void *)0x0) &&
           ((*(byte *)((long)pVVar10->pArray[lVar11] + 0x14) & 0x10) != 0)) {
          __assert_fail("pNode->fMarkA == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                        ,0x1ce,"void Abc_NtkMultiSetBoundsCnf(Abc_Ntk_t *)");
        }
        lVar11 = lVar11 + 1;
      } while (iVar4 != lVar11);
      if (0 < iVar4) {
        lVar11 = 0;
        do {
          pAVar7 = (Abc_Obj_t *)pVVar10->pArray[lVar11];
          if ((pAVar7 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar7->field_0x14 & 0xf) == 7)) {
            if (1 < (pAVar7->vFanouts).nSize) {
              *(uint *)&pAVar7->field_0x14 = *(uint *)&pAVar7->field_0x14 | 0x10;
            }
            iVar4 = Abc_NodeIsMuxType(pAVar7);
            if (iVar4 == 0) {
              if ((*(uint *)&pAVar7->field_0x14 >> 10 & 1) != 0) {
                puVar1 = (uint *)((long)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray] +
                                 0x14);
                *puVar1 = *puVar1 | 0x10;
              }
              if ((pAVar7->field_0x15 & 8) == 0) goto LAB_002d75e2;
            }
            else {
              *(uint *)&pAVar7->field_0x14 = *(uint *)&pAVar7->field_0x14 | 0x10;
              plVar2 = (long *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray];
              puVar1 = (uint *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                         (long)*(int *)plVar2[4] * 8) + 0x14);
              *puVar1 = *puVar1 | 0x10;
              plVar2 = (long *)pAVar7->pNtk->vObjs->pArray[(pAVar7->vFanins).pArray[1]];
              puVar1 = (uint *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                         (long)*(int *)plVar2[4] * 8) + 0x14);
              *puVar1 = *puVar1 | 0x10;
              plVar2 = (long *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray];
              puVar1 = (uint *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                         (long)*(int *)(plVar2[4] + 4) * 8) + 0x14);
              *puVar1 = *puVar1 | 0x10;
              pAVar7 = (Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[(pAVar7->vFanins).pArray[1]];
            }
            puVar1 = (uint *)((long)pAVar7->pNtk->vObjs->pArray[(pAVar7->vFanins).pArray[1]] + 0x14)
            ;
            *puVar1 = *puVar1 | 0x10;
          }
LAB_002d75e2:
          lVar11 = lVar11 + 1;
          pVVar10 = pNtk->vObjs;
        } while (lVar11 < pVVar10->nSize);
      }
    }
    pVVar10 = pNtk->vCos;
    if (0 < pVVar10->nSize) {
      lVar11 = 0;
      do {
        puVar1 = (uint *)(*(long *)(*(long *)(*(long *)(*pVVar10->pArray[lVar11] + 0x20) + 8) +
                                   (long)**(int **)((long)pVVar10->pArray[lVar11] + 0x20) * 8) +
                         0x14);
        *puVar1 = *puVar1 | 0x10;
        lVar11 = lVar11 + 1;
        pVVar10 = pNtk->vCos;
      } while (lVar11 < pVVar10->nSize);
    }
    pVVar10 = pNtk->vObjs;
    if (0 < pVVar10->nSize) {
      lVar11 = 0;
      do {
        pAVar7 = (Abc_Obj_t *)pVVar10->pArray[lVar11];
        if ((pAVar7 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar7->field_0x14 & 0xf) == 7)) {
          Abc_NodeIsMuxType(pAVar7);
        }
        lVar11 = lVar11 + 1;
        pVVar10 = pNtk->vObjs;
      } while (lVar11 < pVVar10->nSize);
    }
  }
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_BDD);
  pAVar7 = Abc_AigConst1(pNtk);
  if (0 < (pAVar7->vFanouts).nSize) {
    pAVar8 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NODE);
    n = Cudd_ReadOne((DdManager *)pNtk_00->pManFunc);
    (pAVar8->field_5).pData = n;
    Cudd_Ref(n);
    (pAVar7->field_6).pCopy = pAVar8;
  }
  p = Extra_ProgressBarStart(_stdout,pNtk->vCos->nSize);
  pVVar10 = pNtk->vCos;
  if (0 < pVVar10->nSize) {
    lVar11 = 0;
    do {
      plVar2 = (long *)pVVar10->pArray[lVar11];
      if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= lVar11)) {
        Extra_ProgressBarUpdate_int(p,(int)lVar11,(char *)0x0);
      }
      pAVar7 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
      uVar6 = *(uint *)&pAVar7->field_0x14 & 0xf;
      if ((uVar6 != 2) && (uVar6 != 5)) {
        Abc_NtkMulti_rec(pNtk_00,pAVar7);
      }
      lVar11 = lVar11 + 1;
      pVVar10 = pNtk->vCos;
    } while (lVar11 < pVVar10->nSize);
  }
  Extra_ProgressBarStop(p);
  pVVar10 = pNtk->vObjs;
  if (0 < pVVar10->nSize) {
    lVar11 = 0;
    do {
      pvVar3 = pVVar10->pArray[lVar11];
      if (pvVar3 != (void *)0x0) {
        *(byte *)((long)pvVar3 + 0x14) = *(byte *)((long)pvVar3 + 0x14) & 0xef;
        *(undefined8 *)((long)pvVar3 + 0x38) = 0;
      }
      lVar11 = lVar11 + 1;
      pVVar10 = pNtk->vObjs;
    } while (lVar11 < pVVar10->nSize);
  }
  Abc_NtkFinalize(pNtk,pNtk_00);
  Abc_NtkMinimumBase(pNtk_00);
  Abc_NtkLogicMakeSimpleCos(pNtk_00,0);
  if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
    pAVar9 = Abc_NtkDup(pNtk->pExdc);
    pNtk_00->pExdc = pAVar9;
  }
  iVar4 = Abc_NtkCheck(pNtk_00);
  if (iVar4 == 0) {
    puts("Abc_NtkMulti: The network check has failed.");
    Abc_NtkDelete(pNtk_00);
    pNtk_00 = (Abc_Ntk_t *)0x0;
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkMulti( Abc_Ntk_t * pNtk, int nThresh, int nFaninMax, int fCnf, int fMulti, int fSimple, int fFactor )
{
    Abc_Ntk_t * pNtkNew;

    assert( Abc_NtkIsStrash(pNtk) );
    assert( nThresh >= 0 );
    assert( nFaninMax > 1 );

    // print a warning about choice nodes
    if ( Abc_NtkGetChoiceNum( pNtk ) )
        printf( "Warning: The choice nodes in the AIG are removed by renoding.\n" );

    // define the boundary
    if ( fCnf )
        Abc_NtkMultiSetBoundsCnf( pNtk );
    else if ( fMulti )
        Abc_NtkMultiSetBoundsMulti( pNtk, nThresh );
    else if ( fSimple )
        Abc_NtkMultiSetBoundsSimple( pNtk );
    else if ( fFactor )
        Abc_NtkMultiSetBoundsFactor( pNtk );
    else
        Abc_NtkMultiSetBounds( pNtk, nThresh, nFaninMax );

    // perform renoding for this boundary
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_BDD );
    Abc_NtkMultiInt( pNtk, pNtkNew );
    Abc_NtkFinalize( pNtk, pNtkNew );

    // make the network minimum base
    Abc_NtkMinimumBase( pNtkNew );

    // fix the problem with complemented and duplicated CO edges
    Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );

    // report the number of CNF objects
    if ( fCnf )
    {
//        int nClauses = Abc_NtkGetClauseNum(pNtkNew) + 2*Abc_NtkPoNum(pNtkNew) + 2*Abc_NtkLatchNum(pNtkNew);
//        printf( "CNF variables = %d. CNF clauses = %d.\n",  Abc_NtkNodeNum(pNtkNew), nClauses );
    }
//printf( "Maximum fanin = %d.\n", Abc_NtkGetFaninMax(pNtkNew) );

    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkMulti: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}